

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O0

void Nwk_ManGraphReportMemoryUsage(Nwk_Grf_t *p)

{
  Nwk_Grf_t *p_local;
  
  p->nMemBytes1 = p->nEdgeHash * 8 + 0xe0 + (p->nObjs + p->nVertsMax) * 4 + p->nEdges * 0x10;
  p->nMemBytes2 = p->nVerts * 0x10 + p->nEdges * 8;
  printf("Memory usage stats:  Preprocessing = %.2f MB.  Solving = %.2f MB.\n",
         ((double)p->nMemBytes1 * 1.0) / 1048576.0,((double)p->nMemBytes2 * 1.0) / 1048576.0);
  return;
}

Assistant:

void Nwk_ManGraphReportMemoryUsage( Nwk_Grf_t * p )
{
    p->nMemBytes1 = 
        sizeof(Nwk_Grf_t) +
        sizeof(void *) * p->nEdgeHash + 
        sizeof(int) * (p->nObjs + p->nVertsMax) +
        sizeof(Nwk_Edg_t) * p->nEdges;
    p->nMemBytes2 = 
        sizeof(Nwk_Vrt_t) * p->nVerts + 
        sizeof(int) * 2 * p->nEdges;
    printf( "Memory usage stats:  Preprocessing = %.2f MB.  Solving = %.2f MB.\n",
        1.0 * p->nMemBytes1 / (1<<20), 1.0 * p->nMemBytes2 / (1<<20) );
}